

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

Vec_Ptr_t * Abc_NodeGetFaninNames(Abc_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj;
  char *pcVar2;
  undefined4 local_24;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode_local;
  
  p = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj = Abc_ObjFanin(pNode,local_24);
    pcVar2 = Abc_ObjName(pObj);
    pcVar2 = Abc_UtilStrsav(pcVar2);
    Vec_PtrPush(p,pcVar2);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NodeGetFaninNames( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pFanin;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Vec_PtrPush( vNodes, Abc_UtilStrsav(Abc_ObjName(pFanin)) );
    return vNodes;
}